

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::ScriptElement::SerializeScriptNum
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          int64_t value)

{
  pointer *ppuVar1;
  iterator iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  bool bVar4;
  undefined1 auStack_28 [6];
  uchar local_22;
  uchar local_21;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (value != 0) {
    uVar3 = -value;
    if (0 < value) {
      uVar3 = value;
    }
    _auStack_28 = in_RAX;
    do {
      _auStack_28 = CONCAT17((uchar)uVar3,_auStack_28);
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
                   iVar2,auStack_28 + 7);
      }
      else {
        *iVar2._M_current = (uchar)uVar3;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      bVar4 = 0xff < uVar3;
      uVar3 = uVar3 >> 8;
    } while (bVar4);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((char)iVar2._M_current[-1] < '\0') {
      if (value < 0) {
        _auStack_28 = CONCAT16(0x80,auStack_28);
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__
                     ,iVar2,auStack_28 + 6);
          return __return_storage_ptr__;
        }
        *iVar2._M_current = 0x80;
      }
      else {
        auStack_28 = (undefined1  [6])CONCAT15(0,auStack_28._0_5_);
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__
                     ,iVar2,auStack_28 + 5);
          return __return_storage_ptr__;
        }
        *iVar2._M_current = '\0';
      }
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    else if (value < 0) {
      iVar2._M_current[-1] = iVar2._M_current[-1] | 0x80;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> ScriptElement::SerializeScriptNum(int64_t value) {
  if (value == 0) {
    return std::vector<uint8_t>();
  }

  std::vector<uint8_t> result;
  const bool is_negative = value < 0;
  uint64_t abstract_value = is_negative ? -value : value;

  while (abstract_value) {
    result.push_back(abstract_value & 0xff);
    abstract_value >>= 8;
  }

  if (result.back() & 0x80) {
    if (is_negative) {
      result.push_back(0x80);
    } else {
      result.push_back(0x00);
    }
  } else if (is_negative) {
    result.back() |= 0x80;
  }

  return result;
}